

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

uint16_t client_get_active_border_width(theme *theme,client *client)

{
  client_state cVar1;
  uint16_t uVar2;
  border_theme *pbVar3;
  
  if (client->is_fullscreen == false) {
    cVar1 = client->state;
    if ((cVar1 & CLIENT_URGENT) == 0) {
      if ((cVar1 & CLIENT_STICKY) == 0) {
        if ((cVar1 & CLIENT_OFF_SCREEN) == 0) {
          pbVar3 = (border_theme *)
                   ((long)&theme->border_width->unfocused + (ulong)((uint)client->is_focused * 2));
        }
        else {
          pbVar3 = theme->border_width;
        }
      }
      else {
        pbVar3 = (border_theme *)&theme->border_width->sticky;
      }
    }
    else {
      pbVar3 = (border_theme *)&theme->border_width->urgent;
    }
    uVar2 = pbVar3->unfocused;
  }
  else {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint16_t client_get_active_border_width(const struct theme *theme, const struct client *client)
{
        if (client->is_fullscreen) {
                return 0;
        }

        if (client->state & CLIENT_URGENT) {
                return theme->border_width->urgent;
        }

        if (client->state & CLIENT_STICKY) {
                return theme->border_width->sticky;
        }

        if (client->state & CLIENT_OFF_SCREEN) {
                return theme->border_width->unfocused;
        }

        if (client->is_focused) {
                return theme->border_width->focused;
        }

        return theme->border_width->unfocused;
}